

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_shared.h
# Opt level: O0

Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> __thiscall
Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
::get_partial_multiplicative_identity
          (Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> *this,
          Characteristic *productOfCharacteristics)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_1c;
  Characteristic idx;
  Characteristic *productOfCharacteristics_local;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> *mult;
  
  if (*productOfCharacteristics == 0) {
    Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
    Shared_multi_field_element_with_small_characteristics<unsigned_int,void>
              ((Shared_multi_field_element_with_small_characteristics<unsigned_int,void> *)this,1);
  }
  else {
    Shared_multi_field_element_with_small_characteristics(this);
    for (local_1c = 0;
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&primes_),
        local_1c < sVar2; local_1c = local_1c + 1) {
      uVar1 = *productOfCharacteristics;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&primes_,(ulong)local_1c);
      if (uVar1 % *pvVar3 == 0) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&partials_,(ulong)local_1c);
        operator+=(this,pvVar3);
      }
    }
  }
  return (Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>)
         (Element_conflict)this;
}

Assistant:

static Shared_multi_field_element_with_small_characteristics get_partial_multiplicative_identity(
      const Characteristic& productOfCharacteristics) {
    if (productOfCharacteristics == 0) {
      return Shared_multi_field_element_with_small_characteristics(multiplicativeID_);
    }
    Shared_multi_field_element_with_small_characteristics mult;
    for (Characteristic idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        mult += partials_[idx];
      }
    }
    return mult;
  }